

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_on_push_response_headers_received
              (nghttp2_session *session,nghttp2_frame *frame,nghttp2_stream *stream)

{
  int iVar1;
  int rv;
  nghttp2_stream *stream_local;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  if (stream->state != NGHTTP2_STREAM_RESERVED) {
    __assert_fail("stream->state == NGHTTP2_STREAM_RESERVED",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0x10f8,
                  "int nghttp2_session_on_push_response_headers_received(nghttp2_session *, nghttp2_frame *, nghttp2_stream *)"
                 );
  }
  if ((frame->hd).stream_id == 0) {
    session_local._4_4_ =
         session_inflate_handle_invalid_connection
                   (session,frame,-0x1f9,"push response HEADERS: stream_id == 0");
  }
  else if (session->server == '\0') {
    iVar1 = session_is_incoming_concurrent_streams_max(session);
    if (iVar1 == 0) {
      iVar1 = session_allow_incoming_new_stream(session);
      if (iVar1 == 0) {
        session_local._4_4_ = -0x67;
      }
      else {
        iVar1 = session_is_incoming_concurrent_streams_pending_max(session);
        if (iVar1 == 0) {
          nghttp2_stream_promise_fulfilled(stream);
          iVar1 = nghttp2_session_is_my_stream_id(session,stream->stream_id);
          if (iVar1 == 0) {
            session->num_incoming_reserved_streams = session->num_incoming_reserved_streams - 1;
          }
          session->num_incoming_streams = session->num_incoming_streams + 1;
          session_local._4_4_ = session_call_on_begin_headers(session,frame);
          if (session_local._4_4_ == 0) {
            session_local._4_4_ = 0;
          }
        }
        else {
          session_local._4_4_ = session_inflate_handle_invalid_stream(session,frame,-0x215);
        }
      }
    }
    else {
      session_local._4_4_ =
           session_inflate_handle_invalid_connection
                     (session,frame,-0x1f9,"push response HEADERS: max concurrent streams exceeded")
      ;
    }
  }
  else {
    session_local._4_4_ =
         session_inflate_handle_invalid_connection
                   (session,frame,-0x1f9,"HEADERS: no HEADERS allowed from client in reserved state"
                   );
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_on_push_response_headers_received(nghttp2_session *session,
                                                      nghttp2_frame *frame,
                                                      nghttp2_stream *stream) {
  int rv = 0;
  assert(stream->state == NGHTTP2_STREAM_RESERVED);
  if (frame->hd.stream_id == 0) {
    return session_inflate_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_PROTO,
        "push response HEADERS: stream_id == 0");
  }

  if (session->server) {
    return session_inflate_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_PROTO,
        "HEADERS: no HEADERS allowed from client in reserved state");
  }

  if (session_is_incoming_concurrent_streams_max(session)) {
    return session_inflate_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_PROTO,
        "push response HEADERS: max concurrent streams exceeded");
  }

  if (!session_allow_incoming_new_stream(session)) {
    /* We don't accept new stream after GOAWAY was sent. */
    return NGHTTP2_ERR_IGN_HEADER_BLOCK;
  }

  if (session_is_incoming_concurrent_streams_pending_max(session)) {
    return session_inflate_handle_invalid_stream(session, frame,
                                                 NGHTTP2_ERR_REFUSED_STREAM);
  }

  nghttp2_stream_promise_fulfilled(stream);
  if (!nghttp2_session_is_my_stream_id(session, stream->stream_id)) {
    --session->num_incoming_reserved_streams;
  }
  ++session->num_incoming_streams;
  rv = session_call_on_begin_headers(session, frame);
  if (rv != 0) {
    return rv;
  }
  return 0;
}